

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_guardedTests.cpp
# Opt level: O1

void __thiscall
MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
::deallocate(MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
             *this,zombie_list_node *memory,size_t size)

{
  pointer *ppeVar1;
  vector<event,_std::allocator<event>_> *this_00;
  iterator __position;
  ulong uVar2;
  event local_20;
  
  if (memory != (zombie_list_node *)0x0) {
    uVar2 = size * 0x18;
    operator_delete(memory,uVar2);
    this_00 = this->log;
    local_20.allocated = false;
    __position._M_current =
         (this_00->super__Vector_base<event,_std::allocator<event>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->super__Vector_base<event,_std::allocator<event>_>)._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      local_20.size = uVar2;
      std::vector<event,_std::allocator<event>_>::_M_realloc_insert<event>
                (this_00,__position,&local_20);
    }
    else {
      (__position._M_current)->size = uVar2;
      *(ulong *)&(__position._M_current)->allocated = (ulong)(uint7)local_20._9_7_ << 8;
      ppeVar1 = &(this_00->super__Vector_base<event,_std::allocator<event>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppeVar1 = *ppeVar1 + 1;
    }
  }
  return;
}

Assistant:

void deallocate(T* memory, size_t size)
    {
        if (memory) {
            std::allocator<T>{}.deallocate(memory, size);
            log->emplace_back(event{size * sizeof(T), false});
        }
    }